

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathStringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlChar *pxVar1;
  xmlXPathObjectPtr val;
  int iStack_20;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      iStack_20 = 0x17;
    }
    else {
      val = valuePop(ctxt);
      if (val != (xmlXPathObjectPtr)0x0) {
        if (val->type != XPATH_STRING) {
          pxVar1 = xmlXPathCastToString(val);
          if (pxVar1 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          xmlXPathReleaseObject(ctxt->context,val);
          val = xmlXPathCacheWrapString(ctxt,pxVar1);
        }
        goto LAB_001b6e8e;
      }
      iStack_20 = 10;
    }
  }
  else {
    if (nargs == 0) {
      pxVar1 = xmlNodeGetContent(ctxt->context->node);
      if (pxVar1 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      val = xmlXPathCacheWrapString(ctxt,pxVar1);
LAB_001b6e8e:
      valuePush(ctxt,val);
      return;
    }
    iStack_20 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathStringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    xmlChar *stringval;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        stringval = xmlXPathCastNodeToString(ctxt->context->node);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        valuePush(ctxt, xmlXPathCacheWrapString(ctxt, stringval));
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_STRING) {
        stringval = xmlXPathCastToString(cur);
        if (stringval == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheWrapString(ctxt, stringval);
    }
    valuePush(ctxt, cur);
}